

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_reader.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
BitstreamReader::unpack_vector<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          BitstreamReader *this)

{
  uchar local_2f;
  ushort local_2e;
  uint16_t i;
  ushort local_1c;
  undefined1 local_19;
  uint16_t vector_size;
  BitstreamReader *pBStack_18;
  BitstreamReader *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  local_19 = 0;
  pBStack_18 = this;
  this_local = (BitstreamReader *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  local_1c = unpack<unsigned_short>(this);
  for (local_2e = 0; local_2e < local_1c; local_2e = local_2e + 1) {
    local_2f = unpack<unsigned_char>(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> unpack_vector()
    {
        std::vector<T> ret;

        uint16_t vector_size = this->unpack<uint16_t>();
        for(uint16_t i=0 ; i<vector_size ; ++i)
            ret.emplace_back(this->unpack<T>());

        return ret;
    }